

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

int __thiscall capnp::SchemaLoader::InitializerImpl::init(InitializerImpl *this,EVP_PKEY_CTX *ctx)

{
  LazyLoadCallback *pLVar1;
  Mutex *this_00;
  uint uVar2;
  RawSchema *in_RAX;
  Maybe<capnp::_::RawSchema_*const_&> MVar3;
  RawSchema *extraout_RAX;
  Fault f;
  Locked<const_kj::Own<capnp::SchemaLoader::Impl>_> lock;
  Fault local_28;
  Mutex *local_20;
  Mutex *local_18;
  
  pLVar1 = (this->callback).ptr;
  if (pLVar1 != (LazyLoadCallback *)0x0) {
    uVar2 = (**pLVar1->_vptr_LazyLoadCallback)(pLVar1,this->loader,*(undefined8 *)ctx);
    in_RAX = (RawSchema *)(ulong)uVar2;
  }
  if (*(long *)(ctx + 0x40) != 0) {
    this_00 = (Mutex *)this->loader;
    kj::_::Mutex::lock(this_00,SHARED);
    local_18 = this_00 + 1;
    local_28.exception = *(Exception **)ctx;
    local_20 = this_00;
    MVar3 = kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
                      ((HashMap<unsigned_long,capnp::_::RawSchema*> *)
                       &this_00[1].waitersHead.ptr[3].prev,(unsigned_long *)&local_28);
    if (MVar3.ptr == (RawSchema **)0x0) {
      in_RAX = (RawSchema *)0x0;
    }
    else {
      in_RAX = *MVar3.ptr;
    }
    if (in_RAX != (RawSchema *)ctx) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[60]>
                (&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x775,FAILED,"mutableSchema == schema",
                 "\"A schema not belonging to this loader used its initializer.\"",
                 (char (*) [60])"A schema not belonging to this loader used its initializer.");
      kj::_::Debug::Fault::fatal(&local_28);
    }
    in_RAX->lazyInitializer = (Initializer *)0x0;
    (in_RAX->defaultBrand).lazyInitializer = (Initializer *)0x0;
    if (local_20 != (Mutex *)0x0) {
      kj::_::Mutex::unlock(local_20,SHARED);
      in_RAX = extraout_RAX;
    }
  }
  return (int)in_RAX;
}

Assistant:

void SchemaLoader::InitializerImpl::init(const _::RawSchema* schema) const {
  KJ_IF_MAYBE(c, callback) {
    c->load(loader, schema->id);
  }

  if (schema->lazyInitializer != nullptr) {
    // The callback declined to load a schema.  We need to disable the initializer so that it
    // doesn't get invoked again later, as we can no longer modify this schema once it is in use.

    // Lock the loader for read to make sure no one is concurrently loading a replacement for this
    // schema node.
    auto lock = loader.impl.lockShared();

    // Get the mutable version of the schema.
    _::RawSchema* mutableSchema = lock->get()->tryGet(schema->id).schema;
    KJ_ASSERT(mutableSchema == schema,
              "A schema not belonging to this loader used its initializer.");

    // Disable the initializer.
#if __GNUC__
    __atomic_store_n(&mutableSchema->lazyInitializer, nullptr, __ATOMIC_RELEASE);
    __atomic_store_n(&mutableSchema->defaultBrand.lazyInitializer, nullptr, __ATOMIC_RELEASE);
#elif _MSC_VER
    std::atomic_thread_fence(std::memory_order_release);
    *static_cast<_::RawSchema::Initializer const* volatile*>(
        &mutableSchema->lazyInitializer) = nullptr;
    *static_cast<_::RawBrandedSchema::Initializer const* volatile*>(
        &mutableSchema->defaultBrand.lazyInitializer) = nullptr;
#else
#error "Platform not supported"
#endif
  }
}